

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

htsFile * hts_open(char *fn,char *mode)

{
  hFILE *hfile_00;
  hFILE *hfile;
  htsFile *fp;
  char *mode_local;
  char *fn_local;
  
  hfile_00 = hopen(fn,mode);
  if ((hfile_00 == (hFILE *)0x0) ||
     (fn_local = (char *)hts_hopen(hfile_00,fn,mode), (htsFile *)fn_local == (htsFile *)0x0)) {
    if (1 < hts_verbose) {
      fprintf(_stderr,"[E::%s] fail to open file \'%s\'\n","hts_open",fn);
    }
    if (hfile_00 != (hFILE *)0x0) {
      hclose_abruptly(hfile_00);
    }
    fn_local = (char *)0x0;
  }
  return (htsFile *)fn_local;
}

Assistant:

htsFile *hts_open(const char *fn, const char *mode)
{
    htsFile *fp = NULL;
    hFILE *hfile = hopen(fn, mode);
    if (hfile == NULL) goto error;

    fp = hts_hopen(hfile, fn, mode);
    if (fp == NULL) goto error;

    return fp;

error:
    if (hts_verbose >= 2)
        fprintf(stderr, "[E::%s] fail to open file '%s'\n", __func__, fn);

    if (hfile)
        hclose_abruptly(hfile);

    return NULL;
}